

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzlib.c
# Opt level: O0

Bool copy_input_until_stop(EState *s)

{
  uint uVar1;
  uint uVar2;
  EState *in_RDI;
  UChar ch_1;
  UInt32 zchh_1;
  UChar ch;
  UInt32 zchh;
  Bool progress_in;
  Bool local_9;
  
  local_9 = '\0';
  if (in_RDI->mode == 2) {
    while ((in_RDI->nblock < in_RDI->nblockMAX && (in_RDI->strm->avail_in != 0))) {
      local_9 = '\x01';
      uVar2 = (uint)(byte)*in_RDI->strm->next_in;
      if ((uVar2 == in_RDI->state_in_ch) || (in_RDI->state_in_len != 1)) {
        if ((uVar2 == in_RDI->state_in_ch) && (in_RDI->state_in_len != 0xff)) {
          in_RDI->state_in_len = in_RDI->state_in_len + 1;
        }
        else {
          if (in_RDI->state_in_ch < 0x100) {
            add_pair_to_block(in_RDI);
          }
          in_RDI->state_in_ch = uVar2;
          in_RDI->state_in_len = 1;
        }
      }
      else {
        uVar1 = in_RDI->state_in_ch;
        in_RDI->blockCRC =
             in_RDI->blockCRC << 8 ^ BZ2_crc32Table[in_RDI->blockCRC >> 0x18 ^ uVar1 & 0xff];
        in_RDI->inUse[in_RDI->state_in_ch] = '\x01';
        in_RDI->block[in_RDI->nblock] = (UChar)uVar1;
        in_RDI->nblock = in_RDI->nblock + 1;
        in_RDI->state_in_ch = uVar2;
      }
      in_RDI->strm->next_in = in_RDI->strm->next_in + 1;
      in_RDI->strm->avail_in = in_RDI->strm->avail_in - 1;
      in_RDI->strm->total_in_lo32 = in_RDI->strm->total_in_lo32 + 1;
      if (in_RDI->strm->total_in_lo32 == 0) {
        in_RDI->strm->total_in_hi32 = in_RDI->strm->total_in_hi32 + 1;
      }
    }
  }
  else {
    while (((in_RDI->nblock < in_RDI->nblockMAX && (in_RDI->strm->avail_in != 0)) &&
           (in_RDI->avail_in_expect != 0))) {
      local_9 = '\x01';
      uVar2 = (uint)(byte)*in_RDI->strm->next_in;
      if ((uVar2 == in_RDI->state_in_ch) || (in_RDI->state_in_len != 1)) {
        if ((uVar2 == in_RDI->state_in_ch) && (in_RDI->state_in_len != 0xff)) {
          in_RDI->state_in_len = in_RDI->state_in_len + 1;
        }
        else {
          if (in_RDI->state_in_ch < 0x100) {
            add_pair_to_block(in_RDI);
          }
          in_RDI->state_in_ch = uVar2;
          in_RDI->state_in_len = 1;
        }
      }
      else {
        uVar1 = in_RDI->state_in_ch;
        in_RDI->blockCRC =
             in_RDI->blockCRC << 8 ^ BZ2_crc32Table[in_RDI->blockCRC >> 0x18 ^ uVar1 & 0xff];
        in_RDI->inUse[in_RDI->state_in_ch] = '\x01';
        in_RDI->block[in_RDI->nblock] = (UChar)uVar1;
        in_RDI->nblock = in_RDI->nblock + 1;
        in_RDI->state_in_ch = uVar2;
      }
      in_RDI->strm->next_in = in_RDI->strm->next_in + 1;
      in_RDI->strm->avail_in = in_RDI->strm->avail_in - 1;
      in_RDI->strm->total_in_lo32 = in_RDI->strm->total_in_lo32 + 1;
      if (in_RDI->strm->total_in_lo32 == 0) {
        in_RDI->strm->total_in_hi32 = in_RDI->strm->total_in_hi32 + 1;
      }
      in_RDI->avail_in_expect = in_RDI->avail_in_expect - 1;
    }
  }
  return local_9;
}

Assistant:

static
Bool copy_input_until_stop ( EState* s )
{
   Bool progress_in = False;

   if (s->mode == BZ_M_RUNNING) {

      /*-- fast track the common case --*/
      while (True) {
         /*-- block full? --*/
         if (s->nblock >= s->nblockMAX) break;
         /*-- no input? --*/
         if (s->strm->avail_in == 0) break;
         progress_in = True;
         ADD_CHAR_TO_BLOCK ( s, (UInt32)(*((UChar*)(s->strm->next_in))) ); 
         s->strm->next_in++;
         s->strm->avail_in--;
         s->strm->total_in_lo32++;
         if (s->strm->total_in_lo32 == 0) s->strm->total_in_hi32++;
      }

   } else {

      /*-- general, uncommon case --*/
      while (True) {
         /*-- block full? --*/
         if (s->nblock >= s->nblockMAX) break;
         /*-- no input? --*/
         if (s->strm->avail_in == 0) break;
         /*-- flush/finish end? --*/
         if (s->avail_in_expect == 0) break;
         progress_in = True;
         ADD_CHAR_TO_BLOCK ( s, (UInt32)(*((UChar*)(s->strm->next_in))) ); 
         s->strm->next_in++;
         s->strm->avail_in--;
         s->strm->total_in_lo32++;
         if (s->strm->total_in_lo32 == 0) s->strm->total_in_hi32++;
         s->avail_in_expect--;
      }
   }
   return progress_in;
}